

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

void json_append_data(lua_State *l,json_config_t *cfg,int current_depth,strbuf_t *json)

{
  uint current_depth_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong n;
  int iVar6;
  lua_Number __x;
  double dVar7;
  
  iVar3 = lua_type(l,-1);
  switch(iVar3) {
  case 1:
    iVar6 = lua_toboolean(l,-1);
    iVar3 = json->length;
    iVar4 = iVar3 - json->size;
    if (iVar6 == 0) {
      if (-6 < iVar4) {
        strbuf_resize(json,iVar3 + 5);
        iVar3 = json->length;
      }
      builtin_strncpy(json->buf + iVar3,"false",5);
      json->length = json->length + 5;
      return;
    }
    if (-5 < iVar4) {
      strbuf_resize(json,iVar3 + 4);
      iVar3 = json->length;
    }
    builtin_strncpy(json->buf + iVar3,"true",4);
    break;
  case 2:
    pvVar5 = lua_touserdata(l,-1);
    if (pvVar5 != (void *)0x0) goto LAB_0013c5ff;
  case 0:
    iVar3 = json->length;
    if (-5 < iVar3 - json->size) {
      strbuf_resize(json,iVar3 + 4);
      iVar3 = json->length;
    }
    builtin_strncpy(json->buf + iVar3,"null",4);
    break;
  case 3:
    json_append_number(l,cfg,json,-1);
    return;
  case 4:
    json_append_string(l,json,-1);
    return;
  case 5:
    current_depth_00 = current_depth + 1;
    if ((cfg->encode_max_depth <= current_depth) || (iVar3 = lua_checkstack(l,3), iVar3 == 0)) {
      if (cfg->encode_keep_buffer == 0) {
        strbuf_free(json);
      }
      luaL_error(l,"Cannot serialise, excessive nesting (%d)",(ulong)current_depth_00);
    }
    lua_pushnil(l);
    iVar3 = lua_next(l,-2);
    if (iVar3 == 0) {
      iVar6 = 0;
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      iVar6 = 0;
      do {
        iVar4 = lua_type(l,-2);
        if (iVar4 != 3) {
LAB_0013c76c:
          lua_settop(l,-3);
          goto LAB_0013c8d2;
        }
        __x = lua_tonumberx(l,-2,(int *)0x0);
        if ((((__x == 0.0) && (!NAN(__x))) || (dVar7 = floor(__x), __x < 1.0)) ||
           ((dVar7 != __x || (NAN(dVar7) || NAN(__x))))) goto LAB_0013c76c;
        if ((double)iVar6 < __x) {
          iVar6 = (int)__x;
        }
        iVar3 = iVar3 + 1;
        lua_settop(l,-2);
        iVar4 = lua_next(l,-2);
      } while (iVar4 != 0);
    }
    if (((cfg->encode_sparse_ratio < 1) || (iVar6 <= cfg->encode_sparse_ratio * iVar3)) ||
       (iVar6 <= cfg->encode_sparse_safe)) {
      if (0 < iVar6) {
        iVar3 = json->length;
        if (-2 < iVar3 - json->size) {
          strbuf_resize(json,iVar3 + 1);
          iVar3 = json->length;
        }
        json->length = iVar3 + 1;
        json->buf[iVar3] = '[';
        bVar2 = true;
        n = 1;
        do {
          if (!bVar2) {
            iVar3 = json->length;
            if (-2 < iVar3 - json->size) {
              strbuf_resize(json,iVar3 + 1);
              iVar3 = json->length;
            }
            json->length = iVar3 + 1;
            json->buf[iVar3] = ',';
          }
          lua_rawgeti(l,-1,n);
          json_append_data(l,cfg,current_depth_00,json);
          lua_settop(l,-2);
          n = n + 1;
          bVar2 = false;
        } while (iVar6 + 1 != n);
        iVar3 = json->length;
        if (-2 < iVar3 - json->size) {
          strbuf_resize(json,iVar3 + 1);
          iVar3 = json->length;
        }
        json->length = iVar3 + 1;
        json->buf[iVar3] = ']';
        return;
      }
    }
    else if (cfg->encode_sparse_convert == 0) {
      json_encode_exception
                (l,(json_config_t *)(ulong)(uint)cfg->encode_keep_buffer,json,-1,
                 "excessively sparse array");
    }
LAB_0013c8d2:
    iVar3 = json->length;
    if (-2 < iVar3 - json->size) {
      strbuf_resize(json,iVar3 + 1);
      iVar3 = json->length;
    }
    json->length = iVar3 + 1;
    json->buf[iVar3] = '{';
    lua_pushnil(l);
    iVar3 = lua_next(l,-2);
    if (iVar3 != 0) {
      while( true ) {
        iVar3 = lua_type(l,-2);
        if (iVar3 == 4) {
          json_append_string(l,json,-2);
          iVar3 = json->length;
          if (-2 < iVar3 - json->size) {
            strbuf_resize(json,iVar3 + 1);
            iVar3 = json->length;
          }
          json->length = iVar3 + 1;
          json->buf[iVar3] = ':';
        }
        else if (iVar3 == 3) {
          iVar3 = json->length;
          if (-2 < iVar3 - json->size) {
            strbuf_resize(json,iVar3 + 1);
            iVar3 = json->length;
          }
          json->length = iVar3 + 1;
          json->buf[iVar3] = '\"';
          json_append_number(l,cfg,json,-2);
          iVar3 = json->length;
          if (-3 < iVar3 - json->size) {
            strbuf_resize(json,iVar3 + 2);
            iVar3 = json->length;
          }
          pcVar1 = json->buf;
          (pcVar1 + iVar3)[0] = '\"';
          (pcVar1 + iVar3)[1] = ':';
          json->length = json->length + 2;
        }
        else {
          json_encode_exception
                    (l,(json_config_t *)(ulong)(uint)cfg->encode_keep_buffer,json,-2,
                     "table key must be a number or string");
        }
        json_append_data(l,cfg,current_depth_00,json);
        lua_settop(l,-2);
        iVar3 = lua_next(l,-2);
        if (iVar3 == 0) break;
        iVar3 = json->length;
        if (-2 < iVar3 - json->size) {
          strbuf_resize(json,iVar3 + 1);
          iVar3 = json->length;
        }
        json->length = iVar3 + 1;
        json->buf[iVar3] = ',';
      }
    }
    iVar3 = json->length;
    if (-2 < iVar3 - json->size) {
      strbuf_resize(json,iVar3 + 1);
      iVar3 = json->length;
    }
    json->length = iVar3 + 1;
    json->buf[iVar3] = '}';
    return;
  default:
LAB_0013c5ff:
    json_encode_exception
              (l,(json_config_t *)(ulong)(uint)cfg->encode_keep_buffer,json,-1,"type not supported")
    ;
    return;
  }
  json->length = json->length + 4;
  return;
}

Assistant:

static void json_append_data(lua_State *l, json_config_t *cfg,
                             int current_depth, strbuf_t *json)
{
    int len;

    switch (lua_type(l, -1)) {
    case LUA_TSTRING:
        json_append_string(l, json, -1);
        break;
    case LUA_TNUMBER:
        json_append_number(l, cfg, json, -1);
        break;
    case LUA_TBOOLEAN:
        if (lua_toboolean(l, -1))
            strbuf_append_mem(json, "true", 4);
        else
            strbuf_append_mem(json, "false", 5);
        break;
    case LUA_TTABLE:
        current_depth++;
        json_check_encode_depth(l, cfg, current_depth, json);
        len = lua_array_length(l, cfg, json);
        if (len > 0)
            json_append_array(l, cfg, current_depth, json, len);
        else
            json_append_object(l, cfg, current_depth, json);
        break;
    case LUA_TNIL:
        strbuf_append_mem(json, "null", 4);
        break;
    case LUA_TLIGHTUSERDATA:
        if (lua_touserdata(l, -1) == NULL) {
            strbuf_append_mem(json, "null", 4);
            break;
        }
    default:
        /* Remaining types (LUA_TFUNCTION, LUA_TUSERDATA, LUA_TTHREAD,
         * and LUA_TLIGHTUSERDATA) cannot be serialised */
        json_encode_exception(l, cfg, json, -1, "type not supported");
        /* never returns */
    }
}